

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocketPrivate::createPlainSocket(QSslSocketPrivate *this,OpenMode openMode)

{
  QObject *parent;
  QTcpSocket *this_00;
  long in_FS_OFFSET;
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QObject **)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8;
  QIODevice::setOpenMode(parent);
  QAbstractSocket::setSocketState((QAbstractSocket *)parent,UnconnectedState);
  QAbstractSocket::setSocketError((QAbstractSocket *)parent,UnknownSocketError);
  QAbstractSocket::setLocalPort((QAbstractSocket *)parent,0);
  QHostAddress::QHostAddress((QHostAddress *)&local_48);
  QAbstractSocket::setLocalAddress((QAbstractSocket *)parent,(QHostAddress *)&local_48);
  QHostAddress::~QHostAddress((QHostAddress *)&local_48);
  QAbstractSocket::setPeerPort((QAbstractSocket *)parent,0);
  QHostAddress::QHostAddress((QHostAddress *)&local_48);
  QAbstractSocket::setPeerAddress((QAbstractSocket *)parent,(QHostAddress *)&local_48);
  QHostAddress::~QHostAddress((QHostAddress *)&local_48);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QAbstractSocket::setPeerName((QAbstractSocket *)parent,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  this_00 = (QTcpSocket *)operator_new(0x10);
  QTcpSocket::QTcpSocket(this_00,parent);
  this->plainSocket = this_00;
  QObject::connect(local_50,(char *)this_00,(QObject *)"2connected()",(char *)parent,0x264074);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect(local_58,(char *)this->plainSocket,(QObject *)"2hostFound()",(char *)parent,
                   0x264095);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)this->plainSocket,(QObject *)"2disconnected()",(char *)parent,
                   0x2640a9);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,(char *)this->plainSocket,
                   (QObject *)"2stateChanged(QAbstractSocket::SocketState)",(char *)parent,0x2640c0)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,(char *)this->plainSocket,
                   (QObject *)"2errorOccurred(QAbstractSocket::SocketError)",(char *)parent,0x2640f3
                  );
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,(char *)this->plainSocket,(QObject *)"2readyRead()",(char *)parent,
                   0x26411f);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,(char *)this->plainSocket,(QObject *)"2channelReadyRead(int)",
                   (char *)parent,0x26414a);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,(char *)this->plainSocket,(QObject *)"2bytesWritten(qint64)",
                   (char *)parent,0x264168);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,(char *)this->plainSocket,(QObject *)"2channelBytesWritten(int,qint64)",
                   (char *)parent,0x2641a6);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,(char *)this->plainSocket,(QObject *)"2readChannelFinished()",
                   (char *)parent,0x2641ce);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)this->plainSocket,
                   (QObject *)"2proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)",
                   (char *)parent,0x24f6f3);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QIODevicePrivate::QRingBufferRef::clear
            ((QRingBufferRef *)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90);
  QIODevicePrivate::QRingBufferRef::clear
            ((QRingBufferRef *)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x98);
  this->connectionEncrypted = false;
  QSslCertificate::clear(&(this->configuration).peerCertificate);
  QList<QSslCertificate>::clear(&(this->configuration).peerCertificateChain);
  this->mode = UnencryptedMode;
  (**(code **)(*(long *)parent + 0x108))
            (parent,(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.readBufferMaxSize);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::createPlainSocket(QIODevice::OpenMode openMode)
{
    Q_Q(QSslSocket);
    q->setOpenMode(openMode); // <- from QIODevice
    q->setSocketState(QAbstractSocket::UnconnectedState);
    q->setSocketError(QAbstractSocket::UnknownSocketError);
    q->setLocalPort(0);
    q->setLocalAddress(QHostAddress());
    q->setPeerPort(0);
    q->setPeerAddress(QHostAddress());
    q->setPeerName(QString());

    plainSocket = new QTcpSocket(q);
    q->connect(plainSocket, SIGNAL(connected()),
               q, SLOT(_q_connectedSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(hostFound()),
               q, SLOT(_q_hostFoundSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(disconnected()),
               q, SLOT(_q_disconnectedSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
               q, SLOT(_q_stateChangedSlot(QAbstractSocket::SocketState)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)),
               q, SLOT(_q_errorSlot(QAbstractSocket::SocketError)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(readyRead()),
               q, SLOT(_q_readyReadSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(channelReadyRead(int)),
               q, SLOT(_q_channelReadyReadSlot(int)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(bytesWritten(qint64)),
               q, SLOT(_q_bytesWrittenSlot(qint64)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(channelBytesWritten(int,qint64)),
               q, SLOT(_q_channelBytesWrittenSlot(int,qint64)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(readChannelFinished()),
               q, SLOT(_q_readChannelFinishedSlot()),
               Qt::DirectConnection);
#ifndef QT_NO_NETWORKPROXY
    q->connect(plainSocket, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
               q, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)));
#endif

    buffer.clear();
    writeBuffer.clear();
    connectionEncrypted = false;
    configuration.peerCertificate.clear();
    configuration.peerCertificateChain.clear();
    mode = QSslSocket::UnencryptedMode;
    q->setReadBufferSize(readBufferMaxSize);
}